

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_bezier_to_lines(SceneGraph *this,Ref<embree::SceneGraph::Node> *node)

{
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *this_00;
  Node *pNVar1;
  long lVar2;
  long *plVar3;
  value_type *pvVar4;
  Hair *pHVar5;
  long *plVar6;
  HairSetNode *pHVar7;
  Hair *hair;
  ulong uVar8;
  Hair *pHVar9;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *p;
  value_type *__x;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *this_01;
  Hair local_60;
  HairSetNode *local_58;
  Ref<embree::SceneGraph::MaterialNode> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar1 = node->ptr;
  if (pNVar1 != (Node *)0x0) {
    plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TransformNode::typeinfo);
    if (plVar6 == (long *)0x0) {
      plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&MultiTransformNode::typeinfo);
      if (plVar6 == (long *)0x0) {
        plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&GroupNode::typeinfo);
        if (plVar6 == (long *)0x0) {
          plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&HairSetNode::typeinfo);
          if (plVar6 != (long *)0x0) {
            (**(code **)(*plVar6 + 0x10))(plVar6);
            pHVar7 = (HairSetNode *)::operator_new(0x118);
            local_50.ptr = (MaterialNode *)plVar6[0x21];
            local_58 = pHVar7;
            if (local_50.ptr != (MaterialNode *)0x0) {
              (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
            }
            HairSetNode::HairSetNode
                      (pHVar7,RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE,&local_50,
                       *(BBox1f *)(plVar6 + 0xd),0);
            (*(pHVar7->super_Node).super_RefCount._vptr_RefCount[2])(pHVar7);
            if (local_50.ptr != (MaterialNode *)0x0) {
              (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
            }
            pvVar4 = (value_type *)plVar6[0x10];
            this_00 = &local_58->positions;
            for (__x = (value_type *)plVar6[0xf]; __x != pvVar4; __x = __x + 1) {
              std::
              vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ::push_back(this_00,__x);
            }
            pHVar5 = (Hair *)plVar6[0x1c];
            this_01 = &local_58->hairs;
            for (pHVar9 = (Hair *)plVar6[0x1b]; pHVar7 = local_58, pHVar9 != pHVar5;
                pHVar9 = pHVar9 + 1) {
              local_60 = *pHVar9;
              std::
              vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
              ::emplace_back<embree::SceneGraph::HairSetNode::Hair>(this_01,&local_60);
              local_60.id = pHVar9->id;
              local_60.vertex = pHVar9->vertex + 1;
              std::
              vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
              ::emplace_back<embree::SceneGraph::HairSetNode::Hair>(this_01,&local_60);
              local_60.id = pHVar9->id;
              local_60.vertex = pHVar9->vertex + 2;
              std::
              vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
              ::emplace_back<embree::SceneGraph::HairSetNode::Hair>(this_01,&local_60);
            }
            *(HairSetNode **)this = local_58;
            (*(local_58->super_Node).super_RefCount._vptr_RefCount[2])(local_58);
            (*(pHVar7->super_Node).super_RefCount._vptr_RefCount[3])(pHVar7);
            (**(code **)(*plVar6 + 0x18))(plVar6);
            return (Ref<embree::SceneGraph::Node>)(Node *)this;
          }
        }
        else {
          local_58 = (HairSetNode *)this;
          (**(code **)(*plVar6 + 0x10))(plVar6);
          for (uVar8 = 0; uVar8 < (ulong)(plVar6[0xe] - plVar6[0xd] >> 3); uVar8 = uVar8 + 1) {
            local_48.ptr = *(Node **)(plVar6[0xd] + uVar8 * 8);
            if (local_48.ptr != (Node *)0x0) {
              (*((local_48.ptr)->super_RefCount)._vptr_RefCount[2])();
            }
            convert_bezier_to_lines((SceneGraph *)&local_60,&local_48);
            lVar2 = plVar6[0xd];
            plVar3 = *(long **)(lVar2 + uVar8 * 8);
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 0x18))();
            }
            *(Hair *)(lVar2 + uVar8 * 8) = local_60;
            if (local_48.ptr != (Node *)0x0) {
              (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
            }
          }
          (**(code **)(*plVar6 + 0x18))(plVar6);
          this = (SceneGraph *)local_58;
        }
      }
      else {
        (**(code **)(*plVar6 + 0x10))(plVar6);
        local_40.ptr = (Node *)plVar6[0x10];
        if (local_40.ptr != (Node *)0x0) {
          (*((local_40.ptr)->super_RefCount)._vptr_RefCount[2])();
        }
        convert_bezier_to_lines((SceneGraph *)&local_60,&local_40);
        if ((long *)plVar6[0x10] != (long *)0x0) {
          (**(code **)(*(long *)plVar6[0x10] + 0x18))();
        }
        *(Hair *)(plVar6 + 0x10) = local_60;
        if (local_40.ptr != (Node *)0x0) {
          (*((local_40.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        (**(code **)(*plVar6 + 0x18))(plVar6);
      }
    }
    else {
      (**(code **)(*plVar6 + 0x10))(plVar6);
      local_38.ptr = (Node *)plVar6[0x13];
      if (local_38.ptr != (Node *)0x0) {
        (*((local_38.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      convert_bezier_to_lines((SceneGraph *)&local_60,&local_38);
      if ((long *)plVar6[0x13] != (long *)0x0) {
        (**(code **)(*(long *)plVar6[0x13] + 0x18))();
      }
      *(Hair *)(plVar6 + 0x13) = local_60;
      if (local_38.ptr != (Node *)0x0) {
        (*((local_38.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      (**(code **)(*plVar6 + 0x18))(plVar6);
    }
  }
  (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
  node->ptr = (Node *)0x0;
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_bezier_to_lines(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_bezier_to_lines(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_bezier_to_lines(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_bezier_to_lines(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::HairSetNode> hmesh = node.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      Ref<SceneGraph::HairSetNode> lmesh = new SceneGraph::HairSetNode(RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE, hmesh->material, hmesh->time_range, 0);

      for (auto& p : hmesh->positions)
        lmesh->positions.push_back(p);

      for (auto& hair : hmesh->hairs) {
        lmesh->hairs.push_back(SceneGraph::HairSetNode::Hair(hair.vertex+0,hair.id));
        lmesh->hairs.push_back(SceneGraph::HairSetNode::Hair(hair.vertex+1,hair.id));
        lmesh->hairs.push_back(SceneGraph::HairSetNode::Hair(hair.vertex+2,hair.id));
      }
      return lmesh.dynamicCast<SceneGraph::Node>();
    }
    return node;
  }